

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O2

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Release
          (HandleAllocator<unsigned_long> *this,unsigned_long handle)

{
  unsigned_long local_10;
  
  if (this->counter_ - 1 == handle) {
    if (this->counter_ < 2) {
      return false;
    }
    this->counter_ = handle;
  }
  else {
    if (handle == 0) {
      return false;
    }
    local_10 = handle;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->freeList_,&local_10);
    this->dirty_ = true;
  }
  return true;
}

Assistant:

bool Release(const T handle) {
    if (handle == counter_ - static_cast<T>(1)) {
      if (counter_ > static_cast<T>(1)) {
        counter_--;
      } else {
        return false;
      }
    } else {
      if (handle >= static_cast<T>(1)) {
        freeList_.push_back(handle);
        // Delay sort until required
        dirty_ = true;
      } else {
        // invalid handle
        return false;
      }
    }

    return true;
  }